

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseData<std::vector<int,std::allocator<int>>>::
resolve<std::vector<int,std::allocator<int>>>
          (PromiseData<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar1;
  vector<int,_std::allocator<int>_> *__tmp;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0014bce8;
  puVar1[2] = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start;
  puVar1[3] = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
  puVar1[4] = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 **)(this + 0x58) = puVar1 + 2;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(undefined8 **)(this + 0x60) = puVar1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::setSettled((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
                *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }